

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disabled_tests_decl.cpp
# Opt level: O2

void __thiscall
iu_FooP_DISABLED__x_iutest_x_Bar_Test::iu_FooP_DISABLED__x_iutest_x_Bar_Test
          (iu_FooP_DISABLED__x_iutest_x_Bar_Test *this)

{
  FooP::FooP(&this->super_type);
  (this->super_type).super_TestWithParam<int>.super_Test._vptr_Test =
       (_func_int **)&PTR__TestWithParam_001494e0;
  (this->super_type).super_TestWithParam<int>.super_WithParamInterface<int>._vptr_WithParamInterface
       = (_func_int **)&PTR__iu_FooP_DISABLED__x_iutest_x_Bar_Test_00149520;
  return;
}

Assistant:

IUTEST_P(FooP_DISABLED_, Bar)
{
}